

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToFront(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  int local_24;
  int i;
  ImGuiWindow *current_front_window;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  g = (ImGuiContext *)window;
  ppIVar2 = ImVector<ImGuiWindow_*>::back(&GImGui->Windows);
  if (((ImGuiContext *)*ppIVar2 != g) &&
     (*(ImGuiContext **)((((ImGuiContext *)*ppIVar2)->IO).NavInputs + 8) != g)) {
    for (local_24 = (pIVar1->Windows).Size + -2; -1 < local_24; local_24 = local_24 + -1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
      if ((ImGuiContext *)*ppIVar2 == g) {
        ImVector<ImGuiWindow_*>::erase(&pIVar1->Windows,(pIVar1->Windows).Data + local_24);
        ImVector<ImGuiWindow_*>::push_back(&pIVar1->Windows,(value_type *)&g);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.Data + i);
            g.Windows.push_back(window);
            break;
        }
}